

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
 __thiscall ninx::parser::Parser::parse_for_statement(Parser *this)

{
  int iVar1;
  string *psVar2;
  Parser *in_RSI;
  Variable *local_118;
  undefined1 local_d8 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  expression;
  string local_c0;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_a0;
  string iterator_name;
  Token *iterator_name_token;
  string local_70;
  allocator local_39;
  string local_38;
  Parser *this_local;
  __single_object *for_condition;
  
  this_local = this;
  iVar1 = TokenReader::check_type(&in_RSI->reader,FOR);
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Expected for statement",&local_39);
    generate_exception(in_RSI,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  TokenReader::get_token(&in_RSI->reader);
  iVar1 = TokenReader::check_type(&in_RSI->reader,VARIABLE);
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"Expected iterator name ( as variable, for example $i )",
               (allocator *)((long)&iterator_name_token + 7));
    generate_exception(in_RSI,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iterator_name_token + 7));
  }
  iterator_name.field_2._8_8_ = TokenReader::get_token(&in_RSI->reader);
  if ((Token *)iterator_name.field_2._8_8_ == (Token *)0x0) {
    local_118 = (Variable *)0x0;
  }
  else {
    local_118 = (Variable *)
                __dynamic_cast(iterator_name.field_2._8_8_,&lexer::token::Token::typeinfo,
                               &lexer::token::Variable::typeinfo,0);
  }
  psVar2 = lexer::token::Variable::get_name_abi_cxx11_(local_118);
  std::__cxx11::string::string((string *)&local_a0,(string *)psVar2);
  iVar1 = TokenReader::check_limiter(&in_RSI->reader,':');
  if (iVar1 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,"Expected :",
               (allocator *)
               ((long)&expression._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                       _M_head_impl + 7));
    generate_exception(in_RSI,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expression._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                       .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                       _M_head_impl + 7));
  }
  TokenReader::get_token(&in_RSI->reader);
  parse_expression((Parser *)&body);
  parse_block((Parser *)local_d8);
  std::
  make_unique<ninx::parser::element::ForStatement,std::__cxx11::string&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
            (&this->origin,&local_a0,&body);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_d8);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&body);
  std::__cxx11::string::~string((string *)&local_a0);
  return (__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ForStatement> ninx::parser::Parser::parse_for_statement() {
    if (reader.check_type(Type::FOR) != 1) {
        generate_exception("Expected for statement");
    }
    reader.get_token();

    // Read the iterator name
    if (reader.check_type(Type::VARIABLE) != 1) {
        generate_exception("Expected iterator name ( as variable, for example $i )");
    }
    auto iterator_name_token {reader.get_token()};
    std::string iterator_name {dynamic_cast<ninx::lexer::token::Variable*>(iterator_name_token)->get_name()};

    // Expect : separator
    if (reader.check_limiter(':') != 1) {
        generate_exception("Expected :");
    }
    reader.get_token();

    // Parse the expression
    auto expression {parse_expression()};

    // Parse the for body
    auto body {parse_block()};

    auto for_condition = std::make_unique<ForStatement>(iterator_name, std::move(expression), std::move(body));

    return for_condition;
}